

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::EmitDisambiguator
          (RustSymbolParser *this,int disambiguator)

{
  undefined8 local_30;
  size_t leading_digit_index;
  char digits [12];
  int disambiguator_local;
  RustSymbolParser *this_local;
  
  digits._4_4_ = disambiguator;
  unique0x100000f3 = this;
  if (disambiguator < 0) {
    this_local._7_1_ = EmitChar(this,'?');
  }
  else if (disambiguator == 0) {
    this_local._7_1_ = EmitChar(this,'0');
  }
  else {
    memset(&leading_digit_index,0,0xc);
    local_30 = 0xb;
    for (; 0 < (int)digits._4_4_; digits._4_4_ = (int)digits._4_4_ / 10) {
      *(char *)((long)&local_30 + local_30 + 7) = (char)((int)digits._4_4_ % 10) + '0';
      local_30 = local_30 + -1;
    }
    this_local._7_1_ = Emit(this,digits + local_30 + -8);
  }
  return this_local._7_1_;
}

Assistant:

ABSL_MUST_USE_RESULT bool EmitDisambiguator(int disambiguator) {
    if (disambiguator < 0) return EmitChar('?');  // parsed but too large
    if (disambiguator == 0) return EmitChar('0');
    // Convert disambiguator to decimal text.  Three digits per byte is enough
    // because 999 > 256.  The bound will remain correct even if future
    // maintenance changes the type of the disambiguator variable.
    char digits[3 * sizeof(disambiguator)] = {};
    size_t leading_digit_index = sizeof(digits) - 1;
    for (; disambiguator > 0; disambiguator /= 10) {
      digits[--leading_digit_index] =
          static_cast<char>('0' + disambiguator % 10);
    }
    return Emit(digits + leading_digit_index);
  }